

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::LazyDescriptor::Set(LazyDescriptor *this,Descriptor *descriptor)

{
  LogMessage *pLVar1;
  LogFinisher local_e2;
  byte local_e1;
  LogMessage local_e0;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Descriptor *local_18;
  Descriptor *descriptor_local;
  LazyDescriptor *this_local;
  
  local_51 = 0;
  local_18 = descriptor;
  descriptor_local = (Descriptor *)this;
  if (this->name_ != (string *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1a9c);
    local_51 = 1;
    pLVar1 = LogMessage::operator<<(&local_50,"CHECK failed: !name_: ");
    LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (this->once_ != (GoogleOnceDynamic *)0x0) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1a9d);
    local_a1 = 1;
    pLVar1 = LogMessage::operator<<(&local_a0,"CHECK failed: !once_: ");
    LogFinisher::operator=(&local_a2,pLVar1);
  }
  if ((local_a1 & 1) != 0) {
    LogMessage::~LogMessage(&local_a0);
  }
  local_e1 = 0;
  if (this->file_ != (FileDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1a9e);
    local_e1 = 1;
    pLVar1 = LogMessage::operator<<(&local_e0,"CHECK failed: !file_: ");
    LogFinisher::operator=(&local_e2,pLVar1);
  }
  if ((local_e1 & 1) != 0) {
    LogMessage::~LogMessage(&local_e0);
  }
  this->descriptor_ = local_18;
  return;
}

Assistant:

void LazyDescriptor::Set(const Descriptor* descriptor) {
  GOOGLE_CHECK(!name_);
  GOOGLE_CHECK(!once_);
  GOOGLE_CHECK(!file_);
  descriptor_ = descriptor;
}